

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cpp
# Opt level: O2

CBString * uniqueItemName(CBString *__return_storage_ptr__,UModelIndex *index)

{
  TreeModel *this;
  bool bVar1;
  byte bVar2;
  UINT8 UVar3;
  UINT8 subtype;
  CBString subtypeString;
  CBString local_110;
  CBString fileText;
  CBString local_e0;
  CBString local_c8;
  CBString itemName;
  CBString local_98;
  CBString itemText;
  CBString local_68;
  CBString local_50;
  CBString local_38;
  
  bVar1 = UModelIndex::isValid(index);
  if (!bVar1) {
    Bstrlib::CBString::CBString(__return_storage_ptr__,"InvalidIndex");
    return __return_storage_ptr__;
  }
  this = index->m;
  TreeModel::name(&itemName,this,index);
  TreeModel::text(&itemText,this,index);
  Bstrlib::CBString::CBString(__return_storage_ptr__,&itemName);
  bVar2 = TreeModel::type(this,index);
  if ((bVar2 - 0x4f < 6) || (bVar2 == 0x42)) {
    if (itemText.super_tagbstring.slen == 0) {
      Bstrlib::CBString::CBString(&subtypeString,&itemName);
    }
    else {
      Bstrlib::CBString::operator+(&fileText,&itemName,'_');
      Bstrlib::CBString::operator+(&subtypeString,&fileText,&itemText);
    }
    Bstrlib::CBString::operator=(__return_storage_ptr__,&subtypeString);
    Bstrlib::CBString::~CBString(&subtypeString);
    if (itemText.super_tagbstring.slen == 0) goto LAB_0013f897;
  }
  else {
    if (bVar2 != 0x43) goto LAB_0013f897;
    TreeModel::findParentOfType((UModelIndex *)&subtypeString,this,index,'B');
    TreeModel::text(&fileText,this,(UModelIndex *)&subtypeString);
    if (fileText.super_tagbstring.slen == 0) {
      TreeModel::name(&local_110,this,(UModelIndex *)&subtypeString);
    }
    else {
      TreeModel::name(&local_50,this,(UModelIndex *)&subtypeString);
      Bstrlib::CBString::operator+(&local_38,&local_50,'_');
      Bstrlib::CBString::operator+(&local_110,&local_38,&fileText);
    }
    Bstrlib::CBString::operator=(__return_storage_ptr__,&local_110);
    Bstrlib::CBString::~CBString(&local_110);
    if (fileText.super_tagbstring.slen != 0) {
      Bstrlib::CBString::~CBString(&local_38);
      Bstrlib::CBString::~CBString(&local_50);
    }
    UVar3 = TreeModel::subtype(this,index);
    if ((UVar3 == '\x02') || (UVar3 = TreeModel::subtype(this,index), UVar3 == '\x18')) {
      TreeModel::name(&local_e0,this,index);
      Bstrlib::CBString::operator+(&local_c8,&local_e0,'_');
      Bstrlib::CBString::operator+(&local_110,&local_c8,__return_storage_ptr__);
      Bstrlib::CBString::operator=(__return_storage_ptr__,&local_110);
      Bstrlib::CBString::~CBString(&local_110);
      Bstrlib::CBString::~CBString(&local_c8);
      Bstrlib::CBString::~CBString(&local_e0);
    }
  }
  Bstrlib::CBString::~CBString(&fileText);
LAB_0013f897:
  UVar3 = TreeModel::type(this,index);
  subtype = TreeModel::subtype(this,index);
  itemSubtypeToUString(&subtypeString,UVar3,subtype);
  UVar3 = TreeModel::type(this,index);
  itemTypeToUString(&local_68,UVar3);
  if (subtypeString.super_tagbstring.slen == 0) {
    Bstrlib::CBString::CBString(&local_98);
  }
  else {
    Bstrlib::operator+(&local_98,'_',&subtypeString);
  }
  Bstrlib::CBString::operator+(&local_e0,&local_68,&local_98);
  Bstrlib::CBString::operator+(&local_c8,&local_e0,'_');
  Bstrlib::CBString::operator+(&local_110,&local_c8,__return_storage_ptr__);
  Bstrlib::CBString::operator=(__return_storage_ptr__,&local_110);
  Bstrlib::CBString::~CBString(&local_110);
  Bstrlib::CBString::~CBString(&local_c8);
  Bstrlib::CBString::~CBString(&local_e0);
  Bstrlib::CBString::~CBString(&local_98);
  Bstrlib::CBString::~CBString(&local_68);
  fixFileName(__return_storage_ptr__,true);
  Bstrlib::CBString::~CBString(&subtypeString);
  Bstrlib::CBString::~CBString(&itemText);
  Bstrlib::CBString::~CBString(&itemName);
  return __return_storage_ptr__;
}

Assistant:

UString uniqueItemName(const UModelIndex & index)
{
    // Sanity check
    if (!index.isValid())
        return UString("InvalidIndex");
    
    // Get model from index
    const TreeModel* model = (const TreeModel*)index.model();
    
    // Construct the name
    UString itemName = model->name(index);
    UString itemText = model->text(index);
    
    // Default name
    UString name = itemName;
    switch (model->type(index)) {
        case Types::NvarEntry:
        case Types::VssEntry:
        case Types::SysFEntry:
        case Types::EvsaEntry:
        case Types::PhoenixFlashMapEntry:
        case Types::InsydeFlashDeviceMapEntry:
        case Types::File:
            name = itemText.isEmpty() ? itemName : itemName + '_' + itemText;
            break;
        case Types::Section: {
            // Get parent file name
            UModelIndex fileIndex = model->findParentOfType(index, Types::File);
            UString fileText = model->text(fileIndex);
            name = fileText.isEmpty() ? model->name(fileIndex) : model->name(fileIndex) + '_' + fileText;
            
            // Special case of GUIDed sections
            if (model->subtype(index) == EFI_SECTION_GUID_DEFINED || model->subtype(index) == EFI_SECTION_FREEFORM_SUBTYPE_GUID) {
                name = model->name(index) +'_' + name;
            }
        } break;
    }
    
    // Populate subtypeString
    UString subtypeString = itemSubtypeToUString(model->type(index), model->subtype(index));
    
    // Create final name
    name = itemTypeToUString(model->type(index))
    + (subtypeString.length() ? ('_' + subtypeString) : UString())
    + '_' + name;
    
    fixFileName(name, true);
    
    return name;
}